

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  PrimRefMB *pPVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  size_t itime;
  int iVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar43 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  vfloat4 a0;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar106;
  undefined1 auVar107 [64];
  undefined1 auVar108 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar109;
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  Vec3fa n0;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar116;
  Vec3ff v3;
  undefined1 auVar115 [16];
  float fVar117;
  undefined1 in_ZMM17 [64];
  undefined1 auVar118 [64];
  undefined1 in_ZMM23 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_2b8;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  unsigned_long local_280;
  size_t local_278;
  size_t local_270;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_268;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_258;
  undefined1 local_248 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_238;
  undefined1 local_228 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  ulong local_1d0;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 uStack_198;
  undefined8 uStack_190;
  anon_class_16_2_07cfa4d6 local_188;
  float local_178;
  undefined4 uStack_174;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  auVar60._16_16_ = in_YmmResult._16_16_;
  auVar60._0_16_ = (range<unsigned_long>)vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar118 = ZEXT1664((undefined1  [16])auVar60._0_16_);
  __return_storage_ptr__->object_range = auVar60._0_16_;
  uVar20 = r->_begin;
  if (uVar20 < r->_end) {
    auVar98 = ZEXT464(0x3f800000);
    auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
    local_258.m128[2] = -INFINITY;
    local_258._0_8_ = 0xff800000ff800000;
    local_258.m128[3] = -INFINITY;
    auVar107 = ZEXT1664((undefined1  [16])local_258);
    local_268.m128[2] = INFINITY;
    local_268._0_8_ = 0x7f8000007f800000;
    local_268.m128[3] = INFINITY;
    auVar110 = ZEXT1664((undefined1  [16])local_268);
    local_280 = 0;
    local_278 = 0;
    local_2b8 = 0;
    local_228 = ZEXT816(0);
    local_248 = SUB6416(ZEXT464(0x3f800000),0);
    local_270 = k;
    local_238 = local_258;
    local_218 = local_268;
    do {
      auVar108 = auVar110._0_16_;
      auVar103 = auVar107._0_16_;
      auVar96 = auVar98._0_16_;
      auVar29 = auVar102._0_16_;
      BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar36._8_8_ = 0;
      auVar36._0_4_ = BVar1.lower;
      auVar36._4_4_ = BVar1.upper;
      auVar42 = vmovshdup_avx(auVar36);
      fVar70 = BVar1.lower;
      fVar80 = auVar42._0_4_ - fVar70;
      uVar18 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar20);
      uVar21 = (ulong)(uVar18 + 3);
      pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar21 < (pBVar2->super_RawBufferView).num) {
        fVar68 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.fnumTimeSegments;
        auVar42 = ZEXT416((uint)(fVar68 * ((t0t1->lower - fVar70) / fVar80) * 1.0000002));
        auVar42 = vroundss_avx(auVar42,auVar42,9);
        auVar42 = vmaxss_avx(auVar29,auVar42);
        auVar41 = ZEXT416((uint)(fVar68 * ((t0t1->upper - fVar70) / fVar80) * 0.99999976));
        auVar41 = vroundss_avx(auVar41,auVar41,10);
        auVar41 = vminss_avx(auVar41,ZEXT416((uint)fVar68));
        if ((uint)(int)auVar42._0_4_ <= (uint)(int)auVar41._0_4_) {
          uVar19 = (ulong)(int)auVar42._0_4_;
          pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          fVar80 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.maxRadiusScale;
          fStack_200 = (float)bezier_basis0._484_8_;
          fStack_1fc = SUB84(bezier_basis0._484_8_,4);
          uStack_198 = bezier_basis0._1648_8_;
          uStack_190 = bezier_basis0._1656_8_;
          fStack_1a4 = SUB84(bezier_basis0._1632_8_,4);
          fStack_1a0 = (float)bezier_basis0._1640_8_;
          fStack_19c = SUB84(bezier_basis0._1640_8_,4);
          uStack_1c0 = bezier_basis0._2796_8_;
          uStack_1b8 = bezier_basis0._2804_8_;
          uStack_1b0 = bezier_basis0._2812_8_;
          uStack_1c4 = SUB84(bezier_basis0._2788_8_,4);
          local_f8 = bezier_basis0._3944_8_;
          uStack_f0 = bezier_basis0._3952_8_;
          uStack_e8 = bezier_basis0._3960_8_;
          uStack_e0 = bezier_basis0._3968_8_;
          uStack_170 = bezier_basis0._5108_8_;
          uStack_168 = bezier_basis0._5116_8_;
          uStack_160 = bezier_basis0._5124_8_;
          uStack_174 = SUB84(bezier_basis0._5100_8_,4);
          uStack_110 = bezier_basis0._6264_8_;
          uStack_108 = bezier_basis0._6272_8_;
          uStack_100 = bezier_basis0._6280_8_;
          local_118 = (float)bezier_basis0._6256_8_;
          uStack_114 = SUB84(bezier_basis0._6256_8_,4);
          local_58 = bezier_basis0._7412_8_;
          uStack_50 = bezier_basis0._7420_8_;
          uStack_48 = bezier_basis0._7428_8_;
          uStack_40 = bezier_basis0._7436_8_;
          local_78 = bezier_basis0._8568_8_;
          uStack_70 = bezier_basis0._8576_8_;
          uStack_68 = bezier_basis0._8584_8_;
          uStack_60 = bezier_basis0._8592_8_;
          lVar22 = uVar19 * 0x38 + 0x10;
          auVar42._8_4_ = 0xddccb9a2;
          auVar42._0_8_ = 0xddccb9a2ddccb9a2;
          auVar42._12_4_ = 0xddccb9a2;
          auVar43._16_16_ = auVar60._16_16_;
          auVar43._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar60 = auVar43;
          do {
            lVar4 = *(long *)((long)pBVar2 + lVar22 + -0x10);
            lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar22);
            lVar27 = lVar5 * (ulong)uVar18;
            auVar29._8_4_ = 0x7fffffff;
            auVar29._0_8_ = 0x7fffffff7fffffff;
            auVar29._12_4_ = 0x7fffffff;
            auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar27)),auVar29);
            if (1.844e+18 <= auVar36._0_4_) {
LAB_01f0958b:
              auVar98 = ZEXT1664(auVar96);
              auVar102 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar107 = ZEXT1664(auVar103);
              auVar110 = ZEXT1664(auVar108);
              goto LAB_01f09972;
            }
            lVar24 = lVar5 * (ulong)(uVar18 + 1);
            auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar24)),auVar29);
            if (1.844e+18 <= auVar36._0_4_) goto LAB_01f0958b;
            lVar25 = lVar5 * (ulong)(uVar18 + 2);
            auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar25)),auVar29);
            if (1.844e+18 <= auVar36._0_4_) goto LAB_01f0958b;
            auVar36 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar21)),auVar29);
            if (1.844e+18 <= auVar36._0_4_) goto LAB_01f0958b;
            auVar36 = *(undefined1 (*) [16])(lVar4 + lVar27);
            uVar14 = vcmpps_avx512vl(auVar36,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar36,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            auVar29 = *(undefined1 (*) [16])(lVar4 + lVar24);
            uVar14 = vcmpps_avx512vl(auVar29,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar29,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            auVar34 = *(undefined1 (*) [16])(lVar4 + lVar25);
            uVar14 = vcmpps_avx512vl(auVar34,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar34,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            auVar30 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar21);
            uVar14 = vcmpps_avx512vl(auVar30,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar30,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            lVar4 = *(long *)((long)pBVar3 + lVar22 + -0x10);
            lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar22);
            auVar37 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)uVar18);
            uVar14 = vcmpps_avx512vl(auVar37,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar37,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            auVar38 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar18 + 1));
            auVar60._0_16_ = (range<unsigned_long>)auVar38;
            uVar14 = vcmpps_avx512vl(auVar38,auVar42,6);
            uVar15 = vcmpps_avx512vl(auVar38,auVar43._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01f0958b;
            auVar42 = vshufps_avx(auVar36,auVar36,0xff);
            auVar35 = vinsertps_avx(auVar36,ZEXT416((uint)(auVar42._0_4_ * fVar80)),0x30);
            auVar42 = vshufps_avx(auVar29,auVar29,0xff);
            auVar29 = vinsertps_avx(auVar29,ZEXT416((uint)(auVar42._0_4_ * fVar80)),0x30);
            auVar42 = vshufps_avx(auVar34,auVar34,0xff);
            auVar39 = vinsertps_avx512f(auVar34,ZEXT416((uint)(auVar42._0_4_ * fVar80)),0x30);
            auVar42 = vshufps_avx(auVar30,auVar30,0xff);
            auVar34 = vinsertps_avx(auVar30,ZEXT416((uint)(auVar42._0_4_ * fVar80)),0x30);
            auVar42 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar18 + 2));
            auVar36 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar21);
            auVar85._8_4_ = 0x80000000;
            auVar85._0_8_ = 0x8000000080000000;
            auVar85._12_4_ = 0x80000000;
            auVar114._0_4_ = auVar34._0_4_ * -0.0;
            auVar114._4_4_ = auVar34._4_4_ * -0.0;
            auVar114._8_4_ = auVar34._8_4_ * -0.0;
            auVar114._12_4_ = auVar34._12_4_ * -0.0;
            auVar30 = vfmadd213ps_avx512vl(ZEXT816(0),auVar39,auVar114);
            auVar40._0_4_ = auVar30._0_4_ + auVar29._0_4_;
            auVar40._4_4_ = auVar30._4_4_ + auVar29._4_4_;
            auVar40._8_4_ = auVar30._8_4_ + auVar29._8_4_;
            auVar40._12_4_ = auVar30._12_4_ + auVar29._12_4_;
            auVar40 = vfmadd231ps_fma(auVar40,auVar35,auVar85);
            auVar77 = auVar118._0_16_;
            auVar30 = vmulps_avx512vl(auVar34,auVar77);
            auVar82._8_4_ = 0x3f000000;
            auVar82._0_8_ = 0x3f0000003f000000;
            auVar82._12_4_ = 0x3f000000;
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar39,auVar82);
            auVar30 = vfmadd231ps_avx512vl(auVar30,auVar29,auVar77);
            auVar71 = vfnmadd231ps_fma(auVar30,auVar35,auVar82);
            auVar30 = vmulps_avx512vl(auVar36,auVar85);
            auVar31 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
            auVar31 = vfmadd213ps_avx512vl(auVar31,auVar42,auVar30);
            auVar31 = vaddps_avx512vl(auVar38,auVar31);
            auVar32 = vfmadd231ps_avx512vl(auVar31,auVar37,auVar85);
            auVar31 = vmulps_avx512vl(auVar36,auVar77);
            auVar31 = vfmadd231ps_avx512vl(auVar31,auVar42,auVar82);
            auVar31 = vfmadd231ps_avx512vl(auVar31,auVar38,auVar77);
            auVar33 = vfnmadd231ps_avx512vl(auVar31,auVar37,auVar82);
            auVar31 = vaddps_avx512vl(auVar39,auVar114);
            auVar31 = vfmadd231ps_avx512vl(auVar31,auVar29,auVar77);
            auVar31 = vfmadd231ps_fma(auVar31,auVar35,auVar85);
            auVar115._0_4_ = auVar34._0_4_ * 0.5;
            auVar115._4_4_ = auVar34._4_4_ * 0.5;
            auVar115._8_4_ = auVar34._8_4_ * 0.5;
            auVar115._12_4_ = auVar34._12_4_ * 0.5;
            auVar34 = vfmadd231ps_avx512vl(auVar115,auVar77,auVar39);
            auVar29 = vfnmadd231ps_fma(auVar34,auVar82,auVar29);
            auVar35 = vfmadd231ps_avx512vl(auVar29,auVar77,auVar35);
            auVar29 = vaddps_avx512vl(auVar42,auVar30);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar38,auVar77);
            auVar34 = vfmadd231ps_fma(auVar29,auVar37,auVar85);
            auVar36 = vmulps_avx512vl(auVar36,auVar82);
            auVar42 = vfmadd231ps_avx512vl(auVar36,auVar77,auVar42);
            auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar82,auVar38);
            auVar36 = vfmadd231ps_avx512vl(auVar42,auVar77,auVar37);
            auVar42 = vshufps_avx(auVar71,auVar71,0xc9);
            auVar29 = vshufps_avx512vl(auVar32,auVar32,0xc9);
            auVar37._0_4_ = auVar71._0_4_ * auVar29._0_4_;
            auVar37._4_4_ = auVar71._4_4_ * auVar29._4_4_;
            auVar37._8_4_ = auVar71._8_4_ * auVar29._8_4_;
            auVar37._12_4_ = auVar71._12_4_ * auVar29._12_4_;
            auVar29 = vfmsub231ps_avx512vl(auVar37,auVar42,auVar32);
            auVar29 = vshufps_avx(auVar29,auVar29,0xc9);
            auVar30 = vshufps_avx512vl(auVar33,auVar33,0xc9);
            auVar30 = vmulps_avx512vl(auVar71,auVar30);
            auVar42 = vfmsub231ps_avx512vl(auVar30,auVar42,auVar33);
            auVar37 = vshufps_avx512vl(auVar42,auVar42,0xc9);
            auVar30 = vshufps_avx512vl(auVar35,auVar35,0xc9);
            auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
            fVar81 = auVar35._0_4_;
            auVar39._0_4_ = fVar81 * auVar42._0_4_;
            fVar69 = auVar35._4_4_;
            auVar39._4_4_ = fVar69 * auVar42._4_4_;
            fVar116 = auVar35._8_4_;
            auVar39._8_4_ = fVar116 * auVar42._8_4_;
            fVar117 = auVar35._12_4_;
            auVar39._12_4_ = fVar117 * auVar42._12_4_;
            auVar42 = vfmsub231ps_avx512vl(auVar39,auVar30,auVar34);
            auVar34 = vshufps_avx(auVar42,auVar42,0xc9);
            auVar42 = vshufps_avx512vl(auVar36,auVar36,0xc9);
            auVar38._0_4_ = fVar81 * auVar42._0_4_;
            auVar38._4_4_ = fVar69 * auVar42._4_4_;
            auVar38._8_4_ = fVar116 * auVar42._8_4_;
            auVar38._12_4_ = fVar117 * auVar42._12_4_;
            auVar42 = vfmsub231ps_avx512vl(auVar38,auVar30,auVar36);
            auVar30 = vshufps_avx(auVar42,auVar42,0xc9);
            auVar42 = vdpps_avx(auVar29,auVar29,0x7f);
            auVar46._16_16_ = auVar60._16_16_;
            auVar46._0_16_ = auVar77;
            auVar44._4_28_ = auVar46._4_28_;
            auVar44._0_4_ = auVar42._0_4_;
            auVar36 = vrsqrt14ss_avx512f(auVar77,auVar44._0_16_);
            auVar38 = vmulss_avx512f(auVar36,SUB6416(ZEXT464(0x3fc00000),0));
            auVar39 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
            auVar39 = vmulss_avx512f(auVar39,auVar36);
            auVar36 = vmulss_avx512f(auVar36,auVar36);
            auVar36 = vmulss_avx512f(auVar39,auVar36);
            auVar38 = vaddss_avx512f(auVar38,auVar36);
            auVar36 = vdpps_avx(auVar29,auVar37,0x7f);
            auVar38 = vbroadcastss_avx512vl(auVar38);
            auVar39 = vmulps_avx512vl(auVar29,auVar38);
            auVar32 = vbroadcastss_avx512vl(auVar42);
            auVar37 = vmulps_avx512vl(auVar32,auVar37);
            fVar70 = auVar36._0_4_;
            auVar32._0_4_ = fVar70 * auVar29._0_4_;
            auVar32._4_4_ = fVar70 * auVar29._4_4_;
            auVar32._8_4_ = fVar70 * auVar29._8_4_;
            auVar32._12_4_ = fVar70 * auVar29._12_4_;
            auVar36 = vsubps_avx(auVar37,auVar32);
            auVar29 = vrcp14ss_avx512f(auVar77,auVar44._0_16_);
            auVar42 = vfnmadd213ss_avx512f(auVar42,auVar29,ZEXT416(0x40000000));
            fVar70 = auVar29._0_4_ * auVar42._0_4_;
            auVar33._0_4_ = fVar70 * auVar36._0_4_;
            auVar33._4_4_ = fVar70 * auVar36._4_4_;
            auVar33._8_4_ = fVar70 * auVar36._8_4_;
            auVar33._12_4_ = fVar70 * auVar36._12_4_;
            auVar37 = vmulps_avx512vl(auVar38,auVar33);
            auVar42 = vdpps_avx(auVar34,auVar34,0x7f);
            auVar53._16_16_ = auVar60._16_16_;
            auVar53._0_16_ = auVar77;
            auVar48._4_28_ = auVar53._4_28_;
            auVar48._0_4_ = auVar42._0_4_;
            auVar36 = vrsqrt14ss_avx512f(auVar77,auVar48._0_16_);
            auVar29 = vmulss_avx512f(auVar36,SUB6416(ZEXT464(0x3fc00000),0));
            auVar38 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
            auVar38 = vmulss_avx512f(auVar38,auVar36);
            auVar36 = vmulss_avx512f(auVar38,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
            auVar36 = vaddss_avx512f(auVar29,auVar36);
            auVar87._0_4_ = auVar36._0_4_;
            auVar87._4_4_ = auVar87._0_4_;
            auVar87._8_4_ = auVar87._0_4_;
            auVar87._12_4_ = auVar87._0_4_;
            auVar36 = vdpps_avx(auVar34,auVar30,0x7f);
            auVar38 = vmulps_avx512vl(auVar34,auVar87);
            auVar29 = vbroadcastss_avx512vl(auVar42);
            auVar29 = vmulps_avx512vl(auVar29,auVar30);
            fVar70 = auVar36._0_4_;
            auVar91._0_4_ = auVar34._0_4_ * fVar70;
            auVar91._4_4_ = auVar34._4_4_ * fVar70;
            auVar91._8_4_ = auVar34._8_4_ * fVar70;
            auVar91._12_4_ = auVar34._12_4_ * fVar70;
            auVar29 = vsubps_avx(auVar29,auVar91);
            auVar36 = vrcp14ss_avx512f(auVar77,auVar48._0_16_);
            auVar42 = vfnmadd213ss_avx512f(auVar42,auVar36,ZEXT416(0x40000000));
            fVar70 = auVar36._0_4_ * auVar42._0_4_;
            auVar42 = vshufps_avx(auVar40,auVar40,0xff);
            auVar32 = vmulps_avx512vl(auVar42,auVar39);
            auVar34 = vsubps_avx(auVar40,auVar32);
            auVar36 = vshufps_avx(auVar71,auVar71,0xff);
            auVar36 = vmulps_avx512vl(auVar36,auVar39);
            auVar77._0_4_ = auVar36._0_4_ + auVar42._0_4_ * auVar37._0_4_;
            auVar77._4_4_ = auVar36._4_4_ + auVar42._4_4_ * auVar37._4_4_;
            auVar77._8_4_ = auVar36._8_4_ + auVar42._8_4_ * auVar37._8_4_;
            auVar77._12_4_ = auVar36._12_4_ + auVar42._12_4_ * auVar37._12_4_;
            auVar30 = vsubps_avx(auVar71,auVar77);
            auVar39 = vaddps_avx512vl(auVar40,auVar32);
            auVar113._0_4_ = auVar71._0_4_ + auVar77._0_4_;
            auVar113._4_4_ = auVar71._4_4_ + auVar77._4_4_;
            auVar113._8_4_ = auVar71._8_4_ + auVar77._8_4_;
            auVar113._12_4_ = auVar71._12_4_ + auVar77._12_4_;
            auVar42 = vshufps_avx(auVar31,auVar31,0xff);
            auVar40 = vmulps_avx512vl(auVar42,auVar38);
            auVar37 = vsubps_avx(auVar31,auVar40);
            auVar36 = vshufps_avx(auVar35,auVar35,0xff);
            auVar36 = vmulps_avx512vl(auVar36,auVar38);
            auVar71._0_4_ = auVar36._0_4_ + auVar42._0_4_ * auVar87._0_4_ * auVar29._0_4_ * fVar70;
            auVar71._4_4_ = auVar36._4_4_ + auVar42._4_4_ * auVar87._0_4_ * auVar29._4_4_ * fVar70;
            auVar71._8_4_ = auVar36._8_4_ + auVar42._8_4_ * auVar87._0_4_ * auVar29._8_4_ * fVar70;
            auVar71._12_4_ =
                 auVar36._12_4_ + auVar42._12_4_ * auVar87._0_4_ * auVar29._12_4_ * fVar70;
            auVar42 = vsubps_avx(auVar35,auVar71);
            auVar112._0_4_ = auVar31._0_4_ + auVar40._0_4_;
            auVar112._4_4_ = auVar31._4_4_ + auVar40._4_4_;
            auVar112._8_4_ = auVar31._8_4_ + auVar40._8_4_;
            auVar112._12_4_ = auVar31._12_4_ + auVar40._12_4_;
            auVar31._0_4_ = fVar81 + auVar71._0_4_;
            auVar31._4_4_ = fVar69 + auVar71._4_4_;
            auVar31._8_4_ = fVar116 + auVar71._8_4_;
            auVar31._12_4_ = fVar117 + auVar71._12_4_;
            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
            auVar29 = vmulps_avx512vl(auVar30,auVar36);
            fVar70 = auVar34._0_4_;
            auVar35._0_4_ = fVar70 + auVar29._0_4_;
            auVar35._4_4_ = auVar34._4_4_ + auVar29._4_4_;
            auVar35._8_4_ = auVar34._8_4_ + auVar29._8_4_;
            auVar35._12_4_ = auVar34._12_4_ + auVar29._12_4_;
            auVar42 = vmulps_avx512vl(auVar42,auVar36);
            auVar42 = vsubps_avx(auVar37,auVar42);
            auVar61._4_4_ = fVar70;
            auVar61._0_4_ = fVar70;
            auVar61._8_4_ = fVar70;
            auVar61._12_4_ = fVar70;
            auVar61._16_4_ = fVar70;
            auVar61._20_4_ = fVar70;
            auVar61._24_4_ = fVar70;
            auVar61._28_4_ = fVar70;
            auVar111._8_4_ = 1;
            auVar111._0_8_ = 0x100000001;
            auVar111._12_4_ = 1;
            auVar111._16_4_ = 1;
            auVar111._20_4_ = 1;
            auVar111._24_4_ = 1;
            auVar111._28_4_ = 1;
            auVar60 = vpermps_avx2(auVar111,ZEXT1632(auVar34));
            auVar44 = vbroadcastss_avx512vl(ZEXT416(2));
            auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar34));
            auVar46 = vbroadcastss_avx512vl(auVar35);
            auVar47 = vpermps_avx512vl(auVar111,ZEXT1632(auVar35));
            auVar48 = vpermps_avx512vl(auVar44,ZEXT1632(auVar35));
            auVar49 = vbroadcastss_avx512vl(auVar42);
            auVar50 = vpermps_avx512vl(auVar111,ZEXT1632(auVar42));
            auVar51 = vpermps_avx512vl(auVar44,ZEXT1632(auVar42));
            auVar52 = vbroadcastss_avx512vl(auVar37);
            auVar53 = vpermps_avx512vl(auVar111,ZEXT1632(auVar37));
            auVar54 = vpermps_avx512vl(auVar44,ZEXT1632(auVar37));
            auVar30._8_8_ = bezier_basis0._3952_8_;
            auVar30._0_8_ = bezier_basis0._3944_8_;
            auVar65._16_8_ = bezier_basis0._3960_8_;
            auVar65._0_16_ = auVar30;
            auVar65._24_8_ = bezier_basis0._3968_8_;
            auVar55 = vmulps_avx512vl(auVar52,auVar65);
            auVar66._8_8_ = bezier_basis0._2796_8_;
            auVar66._0_8_ = bezier_basis0._2788_8_;
            auVar66._16_8_ = bezier_basis0._2804_8_;
            auVar66._24_8_ = bezier_basis0._2812_8_;
            auVar56 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar49);
            auVar55._8_8_ = bezier_basis0._8576_8_;
            auVar55._0_8_ = bezier_basis0._8568_8_;
            auVar55._16_8_ = bezier_basis0._8584_8_;
            auVar55._24_8_ = bezier_basis0._8592_8_;
            auVar52 = vmulps_avx512vl(auVar52,auVar55);
            auVar67._8_8_ = bezier_basis0._7420_8_;
            auVar67._0_8_ = bezier_basis0._7412_8_;
            auVar67._16_8_ = bezier_basis0._7428_8_;
            auVar67._24_8_ = bezier_basis0._7436_8_;
            auVar57 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar49);
            auVar49 = vmulps_avx512vl(auVar53,auVar65);
            auVar49 = vfmadd231ps_avx512vl(auVar49,auVar66,auVar50);
            auVar52 = vmulps_avx512vl(auVar53,auVar55);
            auVar53 = vfmadd231ps_avx512vl(auVar52,auVar67,auVar50);
            auVar50 = vmulps_avx512vl(auVar54,auVar65);
            auVar50 = vfmadd231ps_avx512vl(auVar50,auVar66,auVar51);
            auVar52._8_4_ = fStack_1a0;
            auVar52._0_8_ = bezier_basis0._1632_8_;
            auVar52._12_4_ = fStack_19c;
            auVar52._16_8_ = bezier_basis0._1648_8_;
            auVar52._24_8_ = bezier_basis0._1656_8_;
            auVar56 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar46);
            auVar49 = vfmadd231ps_avx512vl(auVar49,auVar52,auVar47);
            auVar58 = vfmadd231ps_avx512vl(auVar50,auVar52,auVar48);
            auVar50._8_4_ = fStack_200;
            auVar50._0_8_ = bezier_basis0._476_8_;
            auVar50._12_4_ = fStack_1fc;
            auVar50._16_8_ = bezier_basis0._492_8_;
            auVar50._24_8_ = bezier_basis0._500_8_;
            auVar56 = vfmadd231ps_avx512vl(auVar56,auVar50,auVar61);
            auVar59 = vfmadd231ps_avx512vl(auVar49,auVar50,auVar60);
            auVar58 = vfmadd231ps_avx512vl(auVar58,auVar50,auVar45);
            auVar49._4_4_ = auVar54._4_4_ * SUB84(bezier_basis0._8568_8_,4);
            auVar49._0_4_ = auVar54._0_4_ * (float)bezier_basis0._8568_8_;
            auVar49._8_4_ = auVar54._8_4_ * (float)bezier_basis0._8576_8_;
            auVar49._12_4_ = auVar54._12_4_ * SUB84(bezier_basis0._8576_8_,4);
            auVar49._16_4_ = auVar54._16_4_ * (float)bezier_basis0._8584_8_;
            auVar49._20_4_ = auVar54._20_4_ * SUB84(bezier_basis0._8584_8_,4);
            auVar49._24_4_ = auVar54._24_4_ * (float)bezier_basis0._8592_8_;
            auVar49._28_4_ = auVar54._28_4_;
            auVar49 = vfmadd231ps_avx512vl(auVar49,auVar67,auVar51);
            auVar51._8_8_ = bezier_basis0._6264_8_;
            auVar51._0_8_ = bezier_basis0._6256_8_;
            auVar51._16_8_ = bezier_basis0._6272_8_;
            auVar51._24_8_ = bezier_basis0._6280_8_;
            auVar46 = vfmadd231ps_avx512vl(auVar57,auVar51,auVar46);
            auVar53 = vfmadd231ps_avx512vl(auVar53,auVar51,auVar47);
            auVar42 = vfmadd231ps_fma(auVar49,auVar51,auVar48);
            auVar47._8_8_ = bezier_basis0._5108_8_;
            auVar47._0_8_ = bezier_basis0._5100_8_;
            auVar47._16_8_ = bezier_basis0._5116_8_;
            auVar47._24_8_ = bezier_basis0._5124_8_;
            auVar49 = vfmadd231ps_avx512vl(auVar46,auVar47,auVar61);
            auVar60 = vfmadd231ps_avx512vl(auVar53,auVar47,auVar60);
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar47,auVar45);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
            auVar53 = vmulps_avx512vl(auVar49,auVar48);
            auVar54 = vmulps_avx512vl(auVar60,auVar48);
            auVar57 = vmulps_avx512vl(ZEXT1632(auVar42),auVar48);
            auVar38 = ZEXT816(0) << 0x40;
            auVar60 = vblendps_avx(auVar53,ZEXT1632(auVar38),1);
            auVar49 = vblendps_avx(auVar54,ZEXT1632(auVar38),1);
            auVar63 = ZEXT1632(auVar38);
            auVar45 = vblendps_avx(auVar57,auVar63,1);
            auVar46 = vsubps_avx(auVar56,auVar60);
            auVar61 = vsubps_avx512vl(auVar59,auVar49);
            auVar62 = vsubps_avx512vl(auVar58,auVar45);
            auVar60 = vblendps_avx(auVar53,auVar63,0x80);
            auVar49 = vblendps_avx(auVar54,auVar63,0x80);
            auVar45 = vblendps_avx(auVar57,auVar63,0x80);
            auVar64._0_4_ = auVar56._0_4_ + auVar60._0_4_;
            auVar64._4_4_ = auVar56._4_4_ + auVar60._4_4_;
            auVar64._8_4_ = auVar56._8_4_ + auVar60._8_4_;
            auVar64._12_4_ = auVar56._12_4_ + auVar60._12_4_;
            auVar64._16_4_ = auVar56._16_4_ + auVar60._16_4_;
            auVar64._20_4_ = auVar56._20_4_ + auVar60._20_4_;
            auVar64._24_4_ = auVar56._24_4_ + auVar60._24_4_;
            auVar64._28_4_ = auVar56._28_4_ + auVar60._28_4_;
            auVar49 = vaddps_avx512vl(auVar59,auVar49);
            auVar45 = vaddps_avx512vl(auVar58,auVar45);
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar60 = vminps_avx512vl(auVar53,auVar56);
            auVar54 = vminps_avx512vl(auVar53,auVar59);
            auVar57 = vminps_avx512vl(auVar53,auVar58);
            auVar63 = vminps_avx512vl(auVar46,auVar64);
            auVar63 = vminps_avx512vl(auVar60,auVar63);
            auVar60 = vminps_avx512vl(auVar61,auVar49);
            auVar54 = vminps_avx512vl(auVar54,auVar60);
            auVar60 = vminps_avx512vl(auVar62,auVar45);
            auVar57 = vminps_avx512vl(auVar57,auVar60);
            auVar60 = vmaxps_avx(auVar46,auVar64);
            auVar42 = vmulps_avx512vl(auVar113,auVar36);
            auVar34 = vaddps_avx512vl(auVar39,auVar42);
            auVar42 = vmulps_avx512vl(auVar31,auVar36);
            auVar37 = vsubps_avx512vl(auVar112,auVar42);
            in_ZMM23 = ZEXT1664(auVar37);
            auVar64 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar46 = vmaxps_avx512vl(auVar64,auVar56);
            auVar56 = vmaxps_avx512vl(auVar64,auVar59);
            auVar58 = vmaxps_avx512vl(auVar64,auVar58);
            auVar60 = vmaxps_avx(auVar46,auVar60);
            auVar49 = vmaxps_avx(auVar61,auVar49);
            auVar49 = vmaxps_avx(auVar56,auVar49);
            auVar45 = vmaxps_avx(auVar62,auVar45);
            auVar45 = vmaxps_avx(auVar58,auVar45);
            auVar46 = vshufps_avx512vl(auVar63,auVar63,0xb1);
            auVar56 = vminps_avx512vl(auVar63,auVar46);
            auVar46 = vshufpd_avx(auVar56,auVar56,5);
            auVar46 = vminps_avx(auVar56,auVar46);
            auVar42 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar46 = vshufps_avx512vl(auVar54,auVar54,0xb1);
            auVar54 = vminps_avx512vl(auVar54,auVar46);
            auVar46 = vshufpd_avx(auVar54,auVar54,5);
            auVar46 = vminps_avx(auVar54,auVar46);
            auVar36 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar36 = vunpcklps_avx(auVar42,auVar36);
            auVar46 = vshufps_avx512vl(auVar57,auVar57,0xb1);
            auVar54 = vminps_avx512vl(auVar57,auVar46);
            auVar46 = vshufpd_avx(auVar54,auVar54,5);
            auVar46 = vminps_avx(auVar54,auVar46);
            auVar42 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar42 = vinsertps_avx(auVar36,auVar42,0x28);
            auVar46 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar60 = vmaxps_avx(auVar60,auVar46);
            auVar46 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar46);
            auVar36 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar60 = vshufps_avx(auVar49,auVar49,0xb1);
            auVar60 = vmaxps_avx(auVar49,auVar60);
            auVar49 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar49);
            auVar29 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar29 = vunpcklps_avx(auVar36,auVar29);
            auVar60 = vshufps_avx(auVar45,auVar45,0xb1);
            auVar60 = vmaxps_avx(auVar45,auVar60);
            auVar49 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar49);
            auVar36 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar36 = vinsertps_avx(auVar29,auVar36,0x28);
            auVar49 = vbroadcastss_avx512vl(auVar39);
            auVar46 = vpermps_avx512vl(auVar111,ZEXT1632(auVar39));
            auVar54 = vpermps_avx512vl(auVar44,ZEXT1632(auVar39));
            uVar84 = auVar34._0_4_;
            auVar63._4_4_ = uVar84;
            auVar63._0_4_ = uVar84;
            auVar63._8_4_ = uVar84;
            auVar63._12_4_ = uVar84;
            auVar63._16_4_ = uVar84;
            auVar63._20_4_ = uVar84;
            auVar63._24_4_ = uVar84;
            auVar63._28_4_ = uVar84;
            auVar60 = vpermps_avx2(auVar111,ZEXT1632(auVar34));
            auVar56 = vpermps_avx512vl(auVar44,ZEXT1632(auVar34));
            auVar45 = vbroadcastss_avx512vl(auVar37);
            auVar57 = vpermps_avx512vl(auVar111,ZEXT1632(auVar37));
            auVar58 = vpermps_avx512vl(auVar44,ZEXT1632(auVar37));
            auVar59 = vbroadcastss_avx512vl(auVar112);
            auVar61 = vpermps_avx512vl(auVar111,ZEXT1632(auVar112));
            auVar44 = vpermps_avx512vl(auVar44,ZEXT1632(auVar112));
            auVar62 = vmulps_avx512vl(auVar59,auVar65);
            auVar29 = vfmadd231ps_fma(auVar62,auVar66,auVar45);
            auVar59 = vmulps_avx512vl(auVar59,auVar55);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar67,auVar45);
            auVar45 = vmulps_avx512vl(auVar61,auVar65);
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar66,auVar57);
            auVar55 = vmulps_avx512vl(auVar61,auVar55);
            auVar55 = vfmadd231ps_avx512vl(auVar55,auVar67,auVar57);
            auVar65 = vmulps_avx512vl(auVar44,auVar65);
            auVar66 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar58);
            auVar65 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar52,auVar63);
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar60);
            auVar66 = vfmadd231ps_avx512vl(auVar66,auVar52,auVar56);
            auVar52 = vfmadd231ps_avx512vl(auVar65,auVar50,auVar49);
            auVar65 = vfmadd231ps_avx512vl(auVar45,auVar50,auVar46);
            auVar66 = vfmadd231ps_avx512vl(auVar66,auVar50,auVar54);
            auVar45._4_4_ = auVar44._4_4_ * SUB84(bezier_basis0._8568_8_,4);
            auVar45._0_4_ = auVar44._0_4_ * (float)bezier_basis0._8568_8_;
            auVar45._8_4_ = auVar44._8_4_ * (float)bezier_basis0._8576_8_;
            auVar45._12_4_ = auVar44._12_4_ * SUB84(bezier_basis0._8576_8_,4);
            auVar45._16_4_ = auVar44._16_4_ * (float)bezier_basis0._8584_8_;
            auVar45._20_4_ = auVar44._20_4_ * SUB84(bezier_basis0._8584_8_,4);
            auVar45._24_4_ = auVar44._24_4_ * (float)bezier_basis0._8592_8_;
            auVar45._28_4_ = auVar44._28_4_;
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar67,auVar58);
            auVar50 = vfmadd231ps_avx512vl(auVar59,auVar51,auVar63);
            auVar60 = vfmadd231ps_avx512vl(auVar55,auVar51,auVar60);
            auVar29 = vfmadd231ps_fma(auVar45,auVar51,auVar56);
            auVar49 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar49);
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar47,auVar46);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar47,auVar54);
            auVar47 = vmulps_avx512vl(auVar49,auVar48);
            auVar51 = vmulps_avx512vl(auVar60,auVar48);
            auVar55 = vmulps_avx512vl(ZEXT1632(auVar29),auVar48);
            auVar44 = ZEXT1632(auVar38);
            auVar60 = vblendps_avx(auVar47,auVar44,1);
            auVar49 = vblendps_avx(auVar51,auVar44,1);
            auVar45 = vblendps_avx(auVar55,auVar44,1);
            auVar46 = vsubps_avx(auVar52,auVar60);
            auVar50 = vsubps_avx(auVar65,auVar49);
            auVar67 = vsubps_avx512vl(auVar66,auVar45);
            auVar60 = vblendps_avx(auVar47,auVar44,0x80);
            auVar49 = vblendps_avx(auVar51,auVar44,0x80);
            auVar45 = vblendps_avx(auVar55,auVar44,0x80);
            auVar54._0_4_ = auVar52._0_4_ + auVar60._0_4_;
            auVar54._4_4_ = auVar52._4_4_ + auVar60._4_4_;
            auVar54._8_4_ = auVar52._8_4_ + auVar60._8_4_;
            auVar54._12_4_ = auVar52._12_4_ + auVar60._12_4_;
            auVar54._16_4_ = auVar52._16_4_ + auVar60._16_4_;
            auVar54._20_4_ = auVar52._20_4_ + auVar60._20_4_;
            auVar54._24_4_ = auVar52._24_4_ + auVar60._24_4_;
            auVar54._28_4_ = auVar52._28_4_ + auVar60._28_4_;
            auVar56._0_4_ = auVar65._0_4_ + auVar49._0_4_;
            auVar56._4_4_ = auVar65._4_4_ + auVar49._4_4_;
            auVar56._8_4_ = auVar65._8_4_ + auVar49._8_4_;
            auVar56._12_4_ = auVar65._12_4_ + auVar49._12_4_;
            auVar56._16_4_ = auVar65._16_4_ + auVar49._16_4_;
            auVar56._20_4_ = auVar65._20_4_ + auVar49._20_4_;
            auVar56._24_4_ = auVar65._24_4_ + auVar49._24_4_;
            auVar56._28_4_ = auVar65._28_4_ + auVar49._28_4_;
            auVar45 = vaddps_avx512vl(auVar66,auVar45);
            auVar60 = vminps_avx512vl(auVar53,auVar52);
            auVar49 = vminps_avx512vl(auVar53,auVar65);
            auVar47 = vminps_avx512vl(auVar53,auVar66);
            auVar51 = vminps_avx512vl(auVar46,auVar54);
            auVar51 = vminps_avx512vl(auVar60,auVar51);
            auVar60 = vminps_avx512vl(auVar50,auVar56);
            auVar55 = vminps_avx512vl(auVar49,auVar60);
            auVar60 = vminps_avx512vl(auVar67,auVar45);
            auVar47 = vminps_avx512vl(auVar47,auVar60);
            auVar60 = vmaxps_avx(auVar46,auVar54);
            auVar49 = vmaxps_avx512vl(auVar64,auVar52);
            auVar60 = vmaxps_avx(auVar49,auVar60);
            auVar49 = vmaxps_avx(auVar50,auVar56);
            auVar46 = vmaxps_avx512vl(auVar64,auVar65);
            auVar49 = vmaxps_avx(auVar46,auVar49);
            auVar45 = vmaxps_avx(auVar67,auVar45);
            auVar46 = vmaxps_avx512vl(auVar64,auVar66);
            auVar45 = vmaxps_avx(auVar46,auVar45);
            auVar46 = vshufps_avx(auVar51,auVar51,0xb1);
            auVar46 = vminps_avx(auVar51,auVar46);
            auVar50 = vshufpd_avx(auVar46,auVar46,5);
            auVar46 = vminps_avx(auVar46,auVar50);
            auVar29 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar46 = vshufps_avx512vl(auVar55,auVar55,0xb1);
            auVar50 = vminps_avx512vl(auVar55,auVar46);
            auVar46 = vshufpd_avx(auVar50,auVar50,5);
            auVar46 = vminps_avx(auVar50,auVar46);
            auVar34 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar34 = vunpcklps_avx(auVar29,auVar34);
            auVar46 = vshufps_avx512vl(auVar47,auVar47,0xb1);
            auVar50 = vminps_avx512vl(auVar47,auVar46);
            auVar46 = vshufpd_avx(auVar50,auVar50,5);
            auVar46 = vminps_avx(auVar50,auVar46);
            auVar29 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
            auVar29 = vinsertps_avx(auVar34,auVar29,0x28);
            auVar34 = vminps_avx(auVar42,auVar29);
            auVar46 = vshufps_avx(auVar60,auVar60,0xb1);
            auVar60 = vmaxps_avx(auVar60,auVar46);
            auVar46 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar46);
            auVar42 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar60 = vshufps_avx(auVar49,auVar49,0xb1);
            auVar60 = vmaxps_avx(auVar49,auVar60);
            auVar49 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar49);
            auVar29 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar29 = vunpcklps_avx(auVar42,auVar29);
            auVar60 = vshufps_avx(auVar45,auVar45,0xb1);
            auVar60 = vmaxps_avx(auVar45,auVar60);
            auVar49 = vshufpd_avx(auVar60,auVar60,5);
            auVar60 = vmaxps_avx(auVar60,auVar49);
            auVar42 = vmaxps_avx(auVar60._0_16_,auVar60._16_16_);
            auVar42 = vinsertps_avx(auVar29,auVar42,0x28);
            auVar42 = vmaxps_avx(auVar36,auVar42);
            uVar14 = vcmpps_avx512vl(auVar42,auVar43._0_16_,1);
            auVar60._16_16_ = auVar50._16_16_;
            auVar42 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
            uVar15 = vcmpps_avx512vl(auVar34,auVar42,6);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) {
              auVar98 = ZEXT1664(auVar96);
              auVar102 = ZEXT864(0) << 0x20;
              auVar107 = ZEXT1664(auVar103);
              auVar110 = ZEXT1664(auVar108);
              auVar60._0_16_ = (range<unsigned_long>)vxorps_avx512vl(auVar30,auVar30);
              auVar118 = ZEXT1664((undefined1  [16])auVar60._0_16_);
              goto LAB_01f09972;
            }
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + 0x38;
            auVar60._0_16_ = (range<unsigned_long>)vxorps_avx512vl(auVar30,auVar30);
            auVar118 = ZEXT1664((undefined1  [16])auVar60._0_16_);
          } while (uVar19 <= (ulong)(long)(int)auVar41._0_4_);
          auVar36._8_8_ = 0;
          auVar36._0_4_ =
               (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
          auVar36._4_4_ =
               (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.time_range.upper;
          auVar29 = ZEXT816(0) << 0x20;
        }
        local_188.primID = &local_1d0;
        fVar80 = auVar36._0_4_;
        auVar42 = vmovshdup_avx(auVar36);
        local_1c8 = auVar42._0_4_ - fVar80;
        local_178 = (t0t1->lower - fVar80) / local_1c8;
        local_1c8 = (t0t1->upper - fVar80) / local_1c8;
        fVar80 = fVar68 * local_178;
        fVar70 = fVar68 * local_1c8;
        auVar36 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
        auVar41 = vroundss_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),10);
        auVar42 = vmaxss_avx(auVar36,auVar29);
        local_1a8 = auVar42._0_4_;
        auVar42 = vminss_avx(auVar41,ZEXT416((uint)fVar68));
        iVar23 = (int)local_1a8;
        fVar81 = auVar42._0_4_;
        uVar18 = (int)auVar36._0_4_;
        if ((int)auVar36._0_4_ < 0) {
          uVar18 = 0xffffffff;
        }
        iVar26 = (int)fVar68 + 1;
        if ((int)auVar41._0_4_ < (int)fVar68 + 1) {
          iVar26 = (int)auVar41._0_4_;
        }
        local_1d0 = uVar20;
        local_188.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_188,(long)iVar23);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_188,(long)(int)fVar81);
        fVar80 = fVar80 - local_1a8;
        if (iVar26 - uVar18 == 1) {
          auVar42 = ZEXT816(0) << 0x40;
          auVar36 = vmaxss_avx(ZEXT416((uint)fVar80),auVar42);
          fVar68 = auVar36._0_4_;
          fVar80 = 1.0 - fVar68;
          auVar99._0_4_ = fVar68 * local_158.m128[0];
          auVar99._4_4_ = fVar68 * local_158.m128[1];
          auVar99._8_4_ = fVar68 * local_158.m128[2];
          auVar99._12_4_ = fVar68 * local_158.m128[3];
          auVar75._4_4_ = fVar80;
          auVar75._0_4_ = fVar80;
          auVar75._8_4_ = fVar80;
          auVar75._12_4_ = fVar80;
          auVar41 = vfmadd231ps_fma(auVar99,auVar75,(undefined1  [16])local_138);
          auVar104._0_4_ = fVar68 * local_148._0_4_;
          auVar104._4_4_ = fVar68 * local_148._4_4_;
          auVar104._8_4_ = fVar68 * local_148._8_4_;
          auVar104._12_4_ = fVar68 * local_148._12_4_;
          auVar34 = vfmadd231ps_fma(auVar104,local_128,auVar75);
          auVar36 = vmaxss_avx(ZEXT416((uint)(fVar81 - fVar70)),auVar42);
          fVar70 = auVar36._0_4_;
          fVar80 = 1.0 - fVar70;
          auVar86._0_4_ = fVar70 * local_138.m128[0];
          auVar86._4_4_ = fVar70 * local_138.m128[1];
          auVar86._8_4_ = fVar70 * local_138.m128[2];
          auVar86._12_4_ = fVar70 * local_138.m128[3];
          auVar76._4_4_ = fVar80;
          auVar76._0_4_ = fVar80;
          auVar76._8_4_ = fVar80;
          auVar76._12_4_ = fVar80;
          auVar89 = vfmadd231ps_fma(auVar86,auVar76,(undefined1  [16])local_158);
          auVar90._0_4_ = fVar70 * local_128._0_4_;
          auVar90._4_4_ = fVar70 * local_128._4_4_;
          auVar90._8_4_ = fVar70 * local_128._8_4_;
          auVar90._12_4_ = fVar70 * local_128._12_4_;
          auVar93 = vfmadd231ps_fma(auVar90,auVar76,local_148);
          auVar36 = auVar60._16_16_;
          auVar29 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
          auVar118 = ZEXT1664(auVar29);
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_98.field_1,&local_188,(long)(iVar23 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_b8.field_1,&local_188,(long)((int)fVar81 + -1));
          auVar42 = vmaxss_avx(ZEXT416((uint)fVar80),ZEXT816(0) << 0x40);
          fVar69 = auVar42._0_4_;
          auVar100._0_4_ = fVar69 * local_98.m128[0];
          auVar100._4_4_ = fVar69 * local_98.m128[1];
          auVar100._8_4_ = fVar69 * local_98.m128[2];
          auVar100._12_4_ = fVar69 * local_98.m128[3];
          fVar80 = 1.0 - fVar69;
          auVar72._4_4_ = fVar80;
          auVar72._0_4_ = fVar80;
          auVar72._8_4_ = fVar80;
          auVar72._12_4_ = fVar80;
          auVar41 = vfmadd231ps_fma(auVar100,auVar72,(undefined1  [16])local_138);
          auVar105._0_4_ = fVar69 * local_88;
          auVar105._4_4_ = fVar69 * fStack_84;
          auVar105._8_4_ = fVar69 * fStack_80;
          auVar105._12_4_ = fVar69 * fStack_7c;
          auVar34 = vfmadd231ps_fma(auVar105,auVar72,local_128);
          auVar42 = vmaxss_avx(ZEXT416((uint)(fVar81 - fVar70)),ZEXT816(0) << 0x40);
          fVar70 = auVar42._0_4_;
          fVar80 = 1.0 - fVar70;
          auVar88._0_4_ = fVar70 * local_b8.m128[0];
          auVar88._4_4_ = fVar70 * local_b8.m128[1];
          auVar88._8_4_ = fVar70 * local_b8.m128[2];
          auVar88._12_4_ = fVar70 * local_b8.m128[3];
          auVar78._4_4_ = fVar80;
          auVar78._0_4_ = fVar80;
          auVar78._8_4_ = fVar80;
          auVar78._12_4_ = fVar80;
          auVar89 = vfmadd231ps_fma(auVar88,auVar78,(undefined1  [16])local_158);
          auVar92._0_4_ = fVar70 * local_a8;
          auVar92._4_4_ = fVar70 * fStack_a4;
          auVar92._8_4_ = fVar70 * fStack_a0;
          auVar92._12_4_ = fVar70 * fStack_9c;
          auVar93 = vfmadd231ps_fma(auVar92,auVar78,local_148);
          if ((int)(uVar18 + 1) < iVar26) {
            local_118 = local_1c8 - local_178;
            itime = (size_t)(uVar18 + 1);
            iVar26 = ~uVar18 + iVar26;
            do {
              auVar29 = auVar118._0_16_;
              auVar36 = auVar60._16_16_;
              local_1a8 = auVar93._0_4_;
              fStack_1a4 = auVar93._4_4_;
              fStack_1a0 = auVar93._8_4_;
              fStack_19c = auVar93._12_4_;
              local_208 = auVar89._0_4_;
              fStack_204 = auVar89._4_4_;
              fStack_200 = auVar89._8_4_;
              fStack_1fc = auVar89._12_4_;
              fVar70 = ((float)(int)itime / fVar68 - local_178) / local_118;
              fVar80 = 1.0 - fVar70;
              auVar83._0_4_ = local_208 * fVar70;
              auVar83._4_4_ = fStack_204 * fVar70;
              auVar83._8_4_ = fStack_200 * fVar70;
              auVar83._12_4_ = fStack_1fc * fVar70;
              auVar79._4_4_ = fVar80;
              auVar79._0_4_ = fVar80;
              auVar79._8_4_ = fVar80;
              auVar79._12_4_ = fVar80;
              auVar42 = vfmadd231ps_fma(auVar83,auVar79,auVar41);
              local_1c8 = auVar42._0_4_;
              uStack_1c4 = auVar42._4_4_;
              uStack_1c0 = auVar42._8_8_;
              auVar73._0_4_ = local_1a8 * fVar70;
              auVar73._4_4_ = fStack_1a4 * fVar70;
              auVar73._8_4_ = fStack_1a0 * fVar70;
              auVar73._12_4_ = fStack_19c * fVar70;
              auVar42 = vfmadd231ps_fma(auVar73,auVar34,auVar79);
              local_f8 = auVar42._0_8_;
              uStack_f0 = auVar42._8_8_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_d8.field_1,&local_188,itime);
              local_2a8 = auVar34._0_4_;
              fStack_2a4 = auVar34._4_4_;
              fStack_2a0 = auVar34._8_4_;
              fStack_29c = auVar34._12_4_;
              local_298 = auVar41._0_4_;
              fStack_294 = auVar41._4_4_;
              fStack_290 = auVar41._8_4_;
              fStack_28c = auVar41._12_4_;
              auVar41 = vxorps_avx512vl(auVar29,auVar29);
              auVar118 = ZEXT1664(auVar41);
              auVar16._4_4_ = uStack_1c4;
              auVar16._0_4_ = local_1c8;
              auVar16._8_8_ = uStack_1c0;
              auVar42 = vsubps_avx((undefined1  [16])local_d8,auVar16);
              auVar17._8_8_ = uStack_f0;
              auVar17._0_8_ = local_f8;
              auVar29 = vsubps_avx(local_c8,auVar17);
              auVar42 = vminps_avx512vl(auVar42,auVar41);
              auVar60._0_16_ = (range<unsigned_long>)vmaxps_avx512vl(auVar29,auVar41);
              auVar60._16_16_ = auVar36;
              auVar41._0_4_ = local_298 + auVar42._0_4_;
              auVar41._4_4_ = fStack_294 + auVar42._4_4_;
              auVar41._8_4_ = fStack_290 + auVar42._8_4_;
              auVar41._12_4_ = fStack_28c + auVar42._12_4_;
              auVar89._0_4_ = local_208 + auVar42._0_4_;
              auVar89._4_4_ = fStack_204 + auVar42._4_4_;
              auVar89._8_4_ = fStack_200 + auVar42._8_4_;
              auVar89._12_4_ = fStack_1fc + auVar42._12_4_;
              auVar34._0_4_ = local_2a8 + auVar60._0_4_;
              auVar34._4_4_ = fStack_2a4 + auVar60._4_4_;
              auVar34._8_4_ = fStack_2a0 + auVar60._8_4_;
              auVar34._12_4_ = fStack_29c + auVar60._12_4_;
              auVar93._0_4_ = local_1a8 + auVar60._0_4_;
              auVar93._4_4_ = fStack_1a4 + auVar60._4_4_;
              auVar93._8_4_ = fStack_1a0 + auVar60._8_4_;
              auVar93._12_4_ = fStack_19c + auVar60._12_4_;
              itime = itime + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          else {
            auVar36 = auVar60._16_16_;
            auVar42 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
            auVar118 = ZEXT1664(auVar42);
          }
          auVar42 = ZEXT816(0) << 0x40;
        }
        auVar102 = ZEXT1664(auVar42);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar41,ZEXT416(geomID),0x30);
        uVar18 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar19 = (ulong)uVar18;
        BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar74._8_8_ = 0;
        auVar74._0_4_ = BVar1.lower;
        auVar74._4_4_ = BVar1.upper;
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx(auVar34,ZEXT416((uint)uVar20),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar89,ZEXT416(uVar18),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar93,ZEXT416(uVar18),0x30);
        auVar101._8_4_ = 0x3f000000;
        auVar101._0_8_ = 0x3f0000003f000000;
        auVar101._12_4_ = 0x3f000000;
        auVar94._0_4_ = aVar12.x * 0.5;
        auVar94._4_4_ = aVar12.y * 0.5;
        auVar94._8_4_ = aVar12.z * 0.5;
        auVar94._12_4_ = aVar12.field_3.w * 0.5;
        auVar42 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar10,auVar101);
        auVar97._0_4_ = aVar13.x * 0.5;
        auVar97._4_4_ = aVar13.y * 0.5;
        auVar97._8_4_ = aVar13.z * 0.5;
        auVar97._12_4_ = aVar13.field_3.w * 0.5;
        auVar29 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar11,auVar101);
        auVar95._0_4_ = auVar42._0_4_ + auVar29._0_4_;
        auVar95._4_4_ = auVar42._4_4_ + auVar29._4_4_;
        auVar95._8_4_ = auVar42._8_4_ + auVar29._8_4_;
        auVar95._12_4_ = auVar42._12_4_ + auVar29._12_4_;
        auVar42 = vminps_avx(auVar108,(undefined1  [16])aVar10);
        auVar110 = ZEXT1664(auVar42);
        auVar42 = vmaxps_avx(auVar103,(undefined1  [16])aVar11);
        auVar107 = ZEXT1664(auVar42);
        local_268.m128 = (__m128)vminps_avx(local_268.m128,(undefined1  [16])aVar12);
        local_258.m128 = (__m128)vmaxps_avx(local_258.m128,(undefined1  [16])aVar13);
        local_218.m128 = (__m128)vminps_avx(local_218.m128,auVar95);
        local_238.m128 = (__m128)vmaxps_avx(local_238.m128,auVar95);
        uVar21 = vcmpps_avx512vl(auVar96,auVar74,1);
        auVar29 = vinsertps_avx(auVar96,auVar74,0x50);
        auVar42 = vblendps_avx(auVar74,auVar96,2);
        bVar28 = (bool)((byte)uVar21 & 1);
        bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar98 = ZEXT1664(CONCAT412((uint)bVar9 * auVar29._12_4_ | (uint)!bVar9 * auVar42._12_4_,
                                     CONCAT48((uint)bVar8 * auVar29._8_4_ |
                                              (uint)!bVar8 * auVar42._8_4_,
                                              CONCAT44((uint)bVar7 * auVar29._4_4_ |
                                                       (uint)!bVar7 * auVar42._4_4_,
                                                       (uint)bVar28 * auVar29._0_4_ |
                                                       (uint)!bVar28 * auVar42._0_4_))));
        local_280 = local_280 + 1;
        local_278 = local_278 + uVar19;
        bVar28 = local_2b8 < uVar19;
        auVar42 = vmovshdup_avx(auVar74);
        auVar58._16_16_ = auVar36;
        auVar58._0_16_ = local_248;
        auVar57._4_28_ = auVar58._4_28_;
        auVar57._0_4_ = (uint)bVar28 * auVar42._0_4_ + (uint)!bVar28 * local_248._0_4_;
        local_248 = auVar57._0_16_;
        auVar59._16_16_ = auVar36;
        auVar59._0_16_ = local_228;
        auVar60._4_28_ = auVar59._4_28_;
        auVar60._0_4_ = (uint)bVar28 * (int)BVar1.lower + (uint)!bVar28 * local_228._0_4_;
        local_228 = auVar60._0_16_;
        if (local_2b8 <= uVar19) {
          local_2b8 = uVar19;
        }
        pPVar6 = prims->items;
        pPVar6[local_270].lbounds.bounds0.lower.field_0 = aVar10;
        pPVar6[local_270].lbounds.bounds0.upper.field_0 = aVar11;
        pPVar6[local_270].lbounds.bounds1.lower.field_0.field_1 = aVar12;
        pPVar6[local_270].lbounds.bounds1.upper.field_0.field_1 = aVar13;
        pPVar6[local_270].time_range = BVar1;
        local_270 = local_270 + 1;
      }
LAB_01f09972:
      auVar42 = auVar98._0_16_;
      uVar20 = uVar20 + 1;
    } while (uVar20 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_280;
    aVar109 = auVar110._0_16_;
    aVar106 = auVar107._0_16_;
  }
  else {
    auVar42 = SUB6416(ZEXT464(0x3f800000),0);
    local_218.m128[2] = INFINITY;
    local_218._0_8_ = 0x7f8000007f800000;
    local_218.m128[3] = INFINITY;
    local_238.m128[2] = -INFINITY;
    local_238._0_8_ = 0xff800000ff800000;
    local_238.m128[3] = -INFINITY;
    local_228._0_4_ = 0.0;
    local_248._0_4_ = 1.0;
    local_2b8 = 0;
    local_278 = 0;
    local_258 = local_238;
    local_268 = local_218;
    aVar109 = local_218;
    aVar106 = local_238;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar109;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar106;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_268;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_258;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_218;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_238;
  BVar1 = (BBox1f)vmovlps_avx(auVar42);
  __return_storage_ptr__->time_range = BVar1;
  __return_storage_ptr__->num_time_segments = local_278;
  __return_storage_ptr__->max_num_time_segments = local_2b8;
  (__return_storage_ptr__->max_time_range).lower = (float)local_228._0_4_;
  (__return_storage_ptr__->max_time_range).upper = (float)local_248._0_4_;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }